

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  ma_bool32 mVar1;
  ma_uint64 mVar2;
  ulong in_RSI;
  long in_RDI;
  ma_uint32 seekForwardThreshold;
  ma_uint64 byteRangeHi;
  ma_uint64 byteRangeLo;
  ma_uint64 in_stack_ffffffffffffffc8;
  uint uVar3;
  uint uVar4;
  undefined4 local_4;
  
  if (*(short *)(in_RDI + 0x36) == 0) {
    uVar3 = 0x1000;
  }
  else {
    uVar3 = (uint)*(ushort *)(in_RDI + 0x36) << 1;
  }
  uVar4 = uVar3;
  mVar1 = ma_dr_flac__seek_to_first_frame((ma_dr_flac *)CONCAT44(uVar3,uVar3));
  if (mVar1 == 0) {
    local_4 = 0;
  }
  else if (in_RSI < uVar4) {
    mVar2 = ma_dr_flac__seek_forward_by_pcm_frames
                      ((ma_dr_flac *)CONCAT44(uVar4,uVar3),in_stack_ffffffffffffffc8);
    local_4 = (uint)(mVar2 == in_RSI);
  }
  else {
    local_4 = ma_dr_flac__seek_to_pcm_frame__binary_search_internal
                        (pFlac,pcmFrameIndex,byteRangeLo,byteRangeHi);
  }
  return local_4;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    ma_uint64 byteRangeLo;
    ma_uint64 byteRangeHi;
    ma_uint32 seekForwardThreshold = (pFlac->maxBlockSizeInPCMFrames != 0) ? pFlac->maxBlockSizeInPCMFrames*2 : 4096;
    if (ma_dr_flac__seek_to_first_frame(pFlac) == MA_FALSE) {
        return MA_FALSE;
    }
    if (pcmFrameIndex < seekForwardThreshold) {
        return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFrameIndex) == pcmFrameIndex;
    }
    byteRangeLo = pFlac->firstFLACFramePosInBytes;
    byteRangeHi = pFlac->firstFLACFramePosInBytes + (ma_uint64)((ma_int64)(pFlac->totalPCMFrameCount * pFlac->channels * pFlac->bitsPerSample)/8.0f);
    return ma_dr_flac__seek_to_pcm_frame__binary_search_internal(pFlac, pcmFrameIndex, byteRangeLo, byteRangeHi);
}